

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-renderers.c
# Opt level: O3

wchar_t ui_entry_renderer_query_combined_width(wchar_t ind)

{
  wchar_t wVar1;
  
  if (L'\0' < ind) {
    if (ind <= renderer_count) {
      wVar1 = renderers[(ulong)(uint)ind - 1].combined_renderer_index;
      if (wVar1 <= renderer_count && L'\0' < wVar1) {
        if (renderers[(ulong)(uint)wVar1 - 1].backend != (backend_info *)0x0) {
          wVar1 = (*(renderers[(ulong)(uint)wVar1 - 1].backend)->vw_func)
                            (renderers + ((ulong)(uint)wVar1 - 1));
          return wVar1;
        }
      }
    }
  }
  return L'\xffffffff';
}

Assistant:

int ui_entry_renderer_query_combined_width(int ind)
{
	const struct renderer_info *combined_renderer;

	if (ind <= 0 || ind > renderer_count ||
		renderers[ind - 1].combined_renderer_index <= 0 ||
		renderers[ind - 1].combined_renderer_index > renderer_count) {
		return -1;
	}
	combined_renderer =
		&renderers[renderers[ind - 1].combined_renderer_index - 1];
	return (combined_renderer->backend) ?
		(*combined_renderer->backend->vw_func)(combined_renderer) : -1;
}